

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O1

void wallet::RescanWallet
               (CWallet *wallet,WalletRescanReserver *reserver,int64_t time_begin,bool update)

{
  int64_t iVar1;
  UniValue *pUVar2;
  long in_FS_OFFSET;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = CWallet::RescanFromTime(wallet,time_begin,reserver,update);
  if (((wallet->fAbortRescan)._M_base._M_i & 1U) == 0) {
    if (time_begin < iVar1) {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,
                 "Rescan was unable to fully rescan the blockchain. Some transactions may be missing."
                 ,"");
      JSONRPCError(pUVar2,-4,&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else {
    pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Rescan aborted by user.","");
    JSONRPCError(pUVar2,-1,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

static void RescanWallet(CWallet& wallet, const WalletRescanReserver& reserver, int64_t time_begin = TIMESTAMP_MIN, bool update = true)
{
    int64_t scanned_time = wallet.RescanFromTime(time_begin, reserver, update);
    if (wallet.IsAbortingRescan()) {
        throw JSONRPCError(RPC_MISC_ERROR, "Rescan aborted by user.");
    } else if (scanned_time > time_begin) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Rescan was unable to fully rescan the blockchain. Some transactions may be missing.");
    }
}